

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O0

bool __thiscall
ReplayInterface::enqueue_create_descriptor_set_layout
          (ReplayInterface *this,Hash hash,VkDescriptorSetLayoutCreateInfo *create_info,
          VkDescriptorSetLayout *layout)

{
  bool bVar1;
  VkDescriptorSetLayout_T *pVVar2;
  VkDescriptorSetLayoutCreateInfo *local_38;
  Hash recorded_hash;
  VkDescriptorSetLayout *layout_local;
  VkDescriptorSetLayoutCreateInfo *create_info_local;
  Hash hash_local;
  ReplayInterface *this_local;
  
  recorded_hash = (Hash)layout;
  layout_local = (VkDescriptorSetLayout *)create_info;
  create_info_local = (VkDescriptorSetLayoutCreateInfo *)hash;
  hash_local = (Hash)this;
  bVar1 = Fossilize::Hashing::compute_hash_descriptor_set_layout
                    (&this->recorder,create_info,(Hash *)&local_38);
  if (bVar1) {
    if (local_38 == create_info_local) {
      pVVar2 = fake_handle<VkDescriptorSetLayout_T*>((uint64_t)create_info_local);
      *(VkDescriptorSetLayout_T **)recorded_hash = pVVar2;
      this_local._7_1_ =
           Fossilize::StateRecorder::record_descriptor_set_layout
                     (&this->recorder,*(VkDescriptorSetLayout *)recorded_hash,
                      (VkDescriptorSetLayoutCreateInfo *)layout_local,0);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool enqueue_create_descriptor_set_layout(Hash hash, const VkDescriptorSetLayoutCreateInfo *create_info, VkDescriptorSetLayout *layout) override
	{
		Hash recorded_hash;
		if (!Hashing::compute_hash_descriptor_set_layout(recorder, *create_info, &recorded_hash))
			return false;
		if (recorded_hash != hash)
			return false;

		*layout = fake_handle<VkDescriptorSetLayout>(hash);
		return recorder.record_descriptor_set_layout(*layout, *create_info);
	}